

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explode.c
# Opt level: O1

long scatter(int sx,int sy,int blastforce,uint scflags,obj *obj)

{
  byte bVar1;
  char cVar2;
  level *lev;
  char cVar3;
  undefined8 *puVar4;
  boolean bVar5;
  uint uVar6;
  uint uVar7;
  level **pplVar8;
  obj *obj_00;
  char *pcVar9;
  trap *trap;
  undefined8 *puVar10;
  int iVar11;
  obj *poVar12;
  long lVar13;
  int iVar14;
  monst *mtmp;
  undefined8 *__ptr;
  obj *poVar15;
  bool bVar16;
  bool bVar17;
  obj *in_stack_ffffffffffffff68;
  obj *local_80;
  undefined8 *local_60;
  
  pplVar8 = &obj->olev;
  if (obj == (obj *)0x0) {
    pplVar8 = &level;
  }
  lev = *pplVar8;
  bVar16 = true;
  if (lev == level) {
    bVar16 = (viz_array[sy][sx] & 2U) == 0;
  }
  iVar14 = 0;
  local_80 = obj;
  puVar10 = (undefined8 *)0x0;
  puVar4 = (undefined8 *)0x0;
  while( true ) {
    __ptr = puVar4;
    local_60 = puVar10;
    poVar12 = local_80;
    if (obj == (obj *)0x0) {
      poVar12 = lev->objects[sx][sy];
    }
    if (poVar12 == (obj *)0x0) break;
    iVar11 = poVar12->quan;
    if (iVar11 < 2) {
      poVar15 = (obj *)0x0;
      local_80 = (obj *)0x0;
      obj_00 = poVar12;
    }
    else {
      if (0x7fff < iVar11) {
        iVar11 = 0x8000;
      }
      uVar6 = mt_random();
      obj_00 = splitobj(poVar12,(ulong)(SUB164(ZEXT416(uVar6) % SEXT816((long)(iVar11 + -1)),0) + 1)
                       );
      poVar15 = poVar12;
    }
    obj_extract_self(obj_00);
    if ((((scflags & 0x10) == 0) || ((obj_00->otyp & 0xfffeU) != 0x214)) ||
       (uVar6 = mt_random(),
       (uVar6 * -0x33333333 >> 1 | (uint)((uVar6 * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a)) {
      bVar17 = true;
      if (((scflags & 8) != 0) &&
         (((uVar6 = mt_random(),
           (uVar6 * -0x33333333 >> 1 | (uint)((uVar6 * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a
           || ((long)obj_00->otyp == 0x10f)) ||
          ((*(ushort *)&objects[obj_00->otyp].field_0x11 & 0x1f0) == 0x130)))) {
        iVar11 = breaks(obj_00,(xchar)sx,(xchar)sy);
        bVar17 = iVar11 == 0;
      }
    }
    else if (obj_00->otyp == 0x214) {
      if (!bVar16) {
        pcVar9 = Tobjnam(obj_00,"break");
        pline("%s apart.",pcVar9);
      }
      fracture_rock(obj_00);
      place_object(obj_00,lev,sx,sy);
      obj_00 = sobj_at(0x214,lev,sx,sy);
      if (obj_00 == (obj *)0x0) {
        obj_00 = (obj *)0x0;
      }
      else {
        obj_extract_self(obj_00);
        place_object(obj_00,lev,sx,sy);
      }
      bVar17 = false;
    }
    else {
      trap = t_at(lev,sx,sy);
      if ((trap != (trap *)0x0) && ((trap->field_0x8 & 0x1f) == 0x14)) {
        deltrap(lev,trap);
      }
      if (!bVar16) {
        pcVar9 = Tobjnam(obj_00,"crumble");
        pline("%s.",pcVar9);
      }
      break_statue(obj_00);
      place_object(obj_00,lev,sx,sy);
      bVar17 = false;
    }
    puVar10 = local_60;
    puVar4 = __ptr;
    if (bVar17) {
      puVar10 = (undefined8 *)malloc(0x28);
      *puVar10 = 0;
      puVar10[1] = obj_00;
      puVar10[2] = poVar15;
      *(xchar *)(puVar10 + 3) = (xchar)sx;
      *(xchar *)((long)puVar10 + 0x19) = (xchar)sy;
      uVar6 = mt_random();
      *(schar *)((long)puVar10 + 0x1a) = xdir[uVar6 & 7];
      *(schar *)((long)puVar10 + 0x1b) = ""[uVar6 & 7];
      uVar6 = blastforce - obj_00->owt / 0x28;
      if ((int)uVar6 < 2) {
        uVar6 = 1;
      }
      uVar7 = mt_random();
      iVar11 = uVar7 % uVar6 + 1;
      if (iVar14 <= iVar11) {
        iVar14 = iVar11;
      }
      *(int *)((long)puVar10 + 0x1c) = iVar11;
      *(undefined1 *)(puVar10 + 4) = 0;
      puVar4 = puVar10;
      if (__ptr != (undefined8 *)0x0) {
        *local_60 = puVar10;
        puVar4 = __ptr;
      }
    }
  }
  puVar10 = __ptr;
  if (0 < iVar14) {
    do {
      for (; puVar10 != (undefined8 *)0x0; puVar10 = (undefined8 *)*puVar10) {
        iVar11 = *(int *)((long)puVar10 + 0x1c);
        *(int *)((long)puVar10 + 0x1c) = iVar11 + -1;
        if ((0 < iVar11) && (*(char *)(puVar10 + 4) == '\0')) {
          bhitpos.x = *(char *)((long)puVar10 + 0x1a) + *(char *)(puVar10 + 3);
          bhitpos.y = *(char *)((long)puVar10 + 0x1b) + *(char *)((long)puVar10 + 0x19);
          cVar2 = *(char *)(puVar10 + 3);
          cVar3 = *(char *)((long)puVar10 + 0x19);
          if ((byte)(bhitpos.x - 1U) < 0x4f && (byte)bhitpos.y < 0x15) {
            if (((byte)lev->locations[(int)bhitpos.x][(int)bhitpos.y].typ < 0x11) ||
               (bVar5 = closed_door(lev,(int)bhitpos.x,(int)bhitpos.y), bVar5 != '\0')) {
              cVar2 = bhitpos.x - *(char *)((long)puVar10 + 0x1a);
              cVar3 = bhitpos.y - *(char *)((long)puVar10 + 0x1b);
              goto LAB_0019daee;
            }
            mtmp = lev->monsters[bhitpos.x][bhitpos.y];
            if (mtmp == (monst *)0x0) {
              mtmp = (monst *)0x0;
            }
            else if ((mtmp->field_0x61 & 2) != 0) {
              mtmp = (monst *)0x0;
            }
            if (mtmp == (monst *)0x0) {
              if (((bhitpos.x == u.ux) && ((scflags & 4) != 0)) && (bhitpos.y == u.uy)) {
                if (multi != 0) {
                  nomul(0,(char *)0x0);
                }
                bVar1 = (youmonst.data)->msize;
                cVar2 = ((obj *)puVar10[1])->spe;
                iVar11 = dmgval((monst *)0x0,(obj *)puVar10[1],'\x01',&youmonst);
                iVar11 = thitu(((int)cVar2 - (uint)(bVar1 < 3)) + 9,iVar11,(obj *)puVar10[1],
                               (obj *)puVar10[2],(monst *)0x0,(char *)0x0);
                if (iVar11 != 0) {
                  *(int *)((long)puVar10 + 0x1c) = *(int *)((long)puVar10 + 0x1c) + -3;
                  stop_occupation();
                }
              }
            }
            else if ((scflags & 2) != 0) {
              *(int *)((long)puVar10 + 0x1c) = *(int *)((long)puVar10 + 0x1c) + -1;
              iVar11 = ohitmon((monst *)0x0,mtmp,(obj *)puVar10[1],(obj *)puVar10[2],1,'\0');
              if (iVar11 != 0) {
                puVar10[1] = 0;
                cVar2 = bhitpos.x;
                cVar3 = bhitpos.y;
                goto LAB_0019daee;
              }
            }
          }
          else {
LAB_0019daee:
            bhitpos.y = cVar3;
            bhitpos.x = cVar2;
            *(undefined1 *)(puVar10 + 4) = 1;
          }
          *(xchar *)(puVar10 + 3) = bhitpos.x;
          *(xchar *)((long)puVar10 + 0x19) = bhitpos.y;
        }
      }
      bVar16 = 1 < iVar14;
      puVar10 = __ptr;
      iVar14 = iVar14 + -1;
    } while (bVar16);
  }
  lVar13 = 0;
  while (__ptr != (undefined8 *)0x0) {
    puVar10 = (undefined8 *)*__ptr;
    poVar12 = (obj *)__ptr[1];
    iVar14 = (int)*(char *)(__ptr + 3);
    iVar11 = (int)*(char *)((long)__ptr + 0x19);
    if (poVar12 != (obj *)0x0) {
      if (iVar11 != sy || iVar14 != sx) {
        lVar13 = lVar13 + poVar12->quan;
      }
      place_object(poVar12,lev,iVar14,iVar11);
      stackobj(in_stack_ffffffffffffff68);
    }
    free(__ptr);
    newsym(iVar14,iVar11);
    __ptr = puVar10;
  }
  newsym(sx,sy);
  return lVar13;
}

Assistant:

long scatter(int sx, int sy,	/* location of objects to scatter */
             int blastforce,	/* force behind the scattering	*/
             unsigned int scflags,
             struct obj *obj)	/* only scatter this obj        */
{
	struct obj *otmp;
	struct obj *ostack;
	struct level *lev = obj ? obj->olev : level;
	int tmp;
	int farthest = 0;
	uchar typ;
	long qtmp;
	boolean used_up;
	boolean individual_object = obj ? TRUE : FALSE;
	struct monst *mtmp;
	struct scatter_chain *stmp, *stmp2 = 0;
	struct scatter_chain *schain = NULL;
	long total = 0L;
	boolean visible = (lev == level && cansee(sx, sy));

	while ((otmp = individual_object ? obj : lev->objects[sx][sy]) != 0) {
	    if (otmp->quan > 1L) {
		qtmp = otmp->quan - 1;
		if (qtmp > LARGEST_INT) qtmp = LARGEST_INT;
		qtmp = (long)rnd((int)qtmp);
		ostack = otmp;
		otmp = splitobj(otmp, qtmp);
	    } else {
		ostack = NULL;
		obj = NULL; /* all used */
	    }
	    obj_extract_self(otmp);
	    used_up = FALSE;

	    /* 9 in 10 chance of fracturing boulders or statues */
	    if ((scflags & MAY_FRACTURE)
			&& ((otmp->otyp == BOULDER) || (otmp->otyp == STATUE))
			&& rn2(10)) {
		if (otmp->otyp == BOULDER) {
		    if (visible)
			pline("%s apart.", Tobjnam(otmp, "break"));
		    fracture_rock(otmp);
		    place_object(otmp, lev, sx, sy);
		    if ((otmp = sobj_at(BOULDER, lev, sx, sy)) != 0) {
			/* another boulder here, restack it to the top */
			obj_extract_self(otmp);
			place_object(otmp, lev, sx, sy);
		    }
		} else {
		    struct trap *trap;

		    if ((trap = t_at(lev, sx, sy)) && trap->ttyp == STATUE_TRAP)
			    deltrap(lev, trap);
		    if (visible)
			pline("%s.", Tobjnam(otmp, "crumble"));
		    break_statue(otmp);
		    place_object(otmp, lev, sx, sy);	/* put fragments on floor */
		}
		used_up = TRUE;

	    /* 1 in 10 chance of destruction of obj; glass, egg destruction */
	    } else if ((scflags & MAY_DESTROY) && (!rn2(10)
			|| (objects[otmp->otyp].oc_material == GLASS
			|| otmp->otyp == EGG))) {
		if (breaks(otmp, (xchar)sx, (xchar)sy)) used_up = TRUE;
	    }

	    if (!used_up) {
		stmp = malloc(sizeof(struct scatter_chain));
		stmp->next = NULL;
		stmp->obj = otmp;
		stmp->ostack = ostack;
		stmp->ox = sx;
		stmp->oy = sy;
		tmp = rn2(8);		/* get the direction */
		stmp->dx = xdir[tmp];
		stmp->dy = ydir[tmp];
		tmp = blastforce - (otmp->owt/40);
		if (tmp < 1) tmp = 1;
		stmp->range = rnd(tmp); /* anywhere up to that determ. by wt */
		if (farthest < stmp->range) farthest = stmp->range;
		stmp->stopped = FALSE;
		if (!schain)
		    schain = stmp;
		else
		    stmp2->next = stmp;
		stmp2 = stmp;
	    }
	}

	while (farthest-- > 0) {
		for (stmp = schain; stmp; stmp = stmp->next) {
		   if ((stmp->range-- > 0) && (!stmp->stopped)) {
			bhitpos.x = stmp->ox + stmp->dx;
			bhitpos.y = stmp->oy + stmp->dy;
			typ = lev->locations[bhitpos.x][bhitpos.y].typ;
			if (!isok(bhitpos.x, bhitpos.y)) {
				bhitpos.x -= stmp->dx;
				bhitpos.y -= stmp->dy;
				stmp->stopped = TRUE;
			} else if (!ZAP_POS(typ) ||
					closed_door(lev, bhitpos.x, bhitpos.y)) {
				bhitpos.x -= stmp->dx;
				bhitpos.y -= stmp->dy;
				stmp->stopped = TRUE;
			} else if ((mtmp = m_at(lev, bhitpos.x, bhitpos.y)) != 0) {
				if (scflags & MAY_HITMON) {
				    stmp->range--;
				    if (ohitmon(NULL, mtmp, stmp->obj,
						stmp->ostack, 1, FALSE)) {
					stmp->obj = NULL;
					stmp->stopped = TRUE;
				    }
				}
			} else if (bhitpos.x==u.ux && bhitpos.y==u.uy) {
				if (scflags & MAY_HITYOU) {
				    int hitvalu, hitu;

				    if (multi) nomul(0, NULL);
				    hitvalu = 8 + stmp->obj->spe;
				    if (bigmonst(youmonst.data)) hitvalu++;
				    hitu = thitu(hitvalu,
						 dmgval(NULL, stmp->obj, TRUE,
							&youmonst),
						 stmp->obj, stmp->ostack, NULL,
						 NULL);
				    if (hitu) {
					stmp->range -= 3;
					stop_occupation();
				    }
				}
			} else {
				if (scflags & VIS_EFFECTS) {
				    /* tmp_at(bhitpos.x, bhitpos.y); */
				    /* delay_output(); */
				}
			}
			stmp->ox = bhitpos.x;
			stmp->oy = bhitpos.y;
		   }
		}
	}
	for (stmp = schain; stmp; stmp = stmp2) {
		int x,y;

		stmp2 = stmp->next;
		x = stmp->ox; y = stmp->oy;
		if (stmp->obj) {
			if ( x!=sx || y!=sy )
			    total += stmp->obj->quan;
			place_object(stmp->obj, lev, x, y);
			stackobj(stmp->obj);
		}
		free(stmp);
		newsym(x,y);
	}
	newsym(sx,sy);

	return total;
}